

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void __thiscall
icu_63::DateFormatSymbols::createZoneStrings(DateFormatSymbols *this,UnicodeString **otherStrings)

{
  bool bVar1;
  int iVar2;
  UnicodeString **ppUVar3;
  long *plVar4;
  ulong uVar5;
  UnicodeString *pUVar6;
  long lVar7;
  UnicodeString *src;
  UMemory *this_00;
  long lVar8;
  long lVar9;
  
  src = (UnicodeString *)otherStrings;
  ppUVar3 = (UnicodeString **)uprv_malloc_63((long)this->fZoneStringsRowCount << 3);
  this->fZoneStrings = ppUVar3;
  if ((ppUVar3 != (UnicodeString **)0x0) && (0 < this->fZoneStringsRowCount)) {
    uVar5 = (ulong)(uint)this->fZoneStringsColCount;
    lVar9 = 0;
    do {
      iVar2 = (int)uVar5;
      lVar8 = (long)(int)(iVar2 + (uint)(iVar2 == 0));
      lVar7 = lVar8 * 0x40;
      this_00 = (UMemory *)(lVar7 + 8);
      if (iVar2 < 0) {
        this_00 = (UMemory *)0xffffffffffffffff;
      }
      plVar4 = (long *)UMemory::operator_new__(this_00,(size_t)src);
      if (plVar4 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar4 = lVar8;
        pUVar6 = (UnicodeString *)(plVar4 + 1);
        lVar8 = 0;
        do {
          *(undefined ***)((long)plVar4 + lVar8 + 8) = &PTR__UnicodeString_00487e70;
          *(undefined2 *)((long)plVar4 + lVar8 + 0x10) = 2;
          lVar8 = lVar8 + 0x40;
        } while (lVar7 != lVar8);
      }
      this->fZoneStrings[lVar9] = pUVar6;
      if (this->fZoneStrings[lVar9] == (UnicodeString *)0x0) {
        do {
          pUVar6 = this->fZoneStrings[lVar9];
          if (pUVar6 != (UnicodeString *)0x0) {
            lVar7 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
            if (lVar7 != 0) {
              lVar7 = lVar7 << 6;
              do {
                icu_63::UnicodeString::~UnicodeString
                          ((UnicodeString *)
                           ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar7)
                          );
                lVar7 = lVar7 + -0x40;
              } while (lVar7 != 0);
            }
            UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),src);
          }
          bVar1 = 0 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar1);
        uprv_free_63(this->fZoneStrings);
        this->fZoneStrings = (UnicodeString **)0x0;
        return;
      }
      uVar5 = (ulong)(uint)this->fZoneStringsColCount;
      if (0 < this->fZoneStringsColCount) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          src = (UnicodeString *)
                ((long)&(otherStrings[lVar9]->super_Replaceable).super_UObject._vptr_UObject + lVar7
                );
          icu_63::UnicodeString::fastCopyFrom
                    ((UnicodeString *)
                     ((long)&(this->fZoneStrings[lVar9]->super_Replaceable).super_UObject.
                             _vptr_UObject + lVar7),src);
          lVar8 = lVar8 + 1;
          uVar5 = (ulong)this->fZoneStringsColCount;
          lVar7 = lVar7 + 0x40;
        } while (lVar8 < (long)uVar5);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->fZoneStringsRowCount);
  }
  return;
}

Assistant:

void
DateFormatSymbols::createZoneStrings(const UnicodeString *const * otherStrings)
{
    int32_t row, col;
    UBool failed = FALSE;

    fZoneStrings = (UnicodeString **)uprv_malloc(fZoneStringsRowCount * sizeof(UnicodeString *));
    if (fZoneStrings != NULL) {
        for (row=0; row<fZoneStringsRowCount; ++row)
        {
            fZoneStrings[row] = newUnicodeStringArray(fZoneStringsColCount);
            if (fZoneStrings[row] == NULL) {
                failed = TRUE;
                break;
            }
            for (col=0; col<fZoneStringsColCount; ++col) {
                // fastCopyFrom() - see assignArray comments
                fZoneStrings[row][col].fastCopyFrom(otherStrings[row][col]);
            }
        }
    }
    // If memory allocation failed, roll back and delete fZoneStrings
    if (failed) {
        for (int i = row; i >= 0; i--) {
            delete[] fZoneStrings[i];
        }
        uprv_free(fZoneStrings);
        fZoneStrings = NULL;
    }
}